

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonArrayFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 local_b8 [48];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._8_8_ = local_b8 + 0x22;
  local_b8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._16_8_ = 100;
  local_b8._24_8_ = 1;
  local_b8[0x20] = '\x01';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '[';
  local_b8[0x23] = -0x56;
  local_b8[0x24] = -0x56;
  local_b8[0x25] = -0x56;
  local_b8[0x26] = -0x56;
  local_b8[0x27] = -0x56;
  local_b8._0_8_ = ctx;
  if (argc < 1) {
    local_b8._24_8_ = 1;
  }
  else {
    uVar3 = 0;
    do {
      jsonAppendSeparator((JsonString *)local_b8);
      jsonAppendSqlValue((JsonString *)local_b8,argv[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
    if ((ulong)local_b8._16_8_ <= (ulong)local_b8._24_8_) {
      jsonAppendCharExpand((JsonString *)local_b8,']');
      goto LAB_001b7566;
    }
  }
  *(char *)(local_b8._8_8_ + local_b8._24_8_) = ']';
  local_b8._24_8_ = local_b8._24_8_ + 1;
LAB_001b7566:
  jsonReturnString((JsonString *)local_b8,(JsonParse *)0x0,(sqlite3_context *)0x0);
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonArrayFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;

  jsonStringInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=0; i<argc; i++){
    jsonAppendSeparator(&jx);
    jsonAppendSqlValue(&jx, argv[i]);
  }
  jsonAppendChar(&jx, ']');
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}